

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O0

int arkEwtSetSS(N_Vector ycur,N_Vector weight,void *arkode_mem)

{
  N_Vector in_RDX;
  realtype rVar1;
  ARKodeMem ark_mem;
  N_Vector x;
  int local_4;
  
  x = in_RDX;
  N_VAbs(in_RDX,in_RDX);
  N_VScale((realtype)x,in_RDX,(N_Vector)0xebf1f5);
  N_VAddConst(x,(realtype)in_RDX,(N_Vector)0xebf219);
  if ((*(int *)&in_RDX[2].ops == 0) || (rVar1 = N_VMin(x), 0.0 < rVar1)) {
    N_VInv(x,in_RDX);
    local_4 = 0;
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int arkEwtSetSS(N_Vector ycur, N_Vector weight, void* arkode_mem)
{
  ARKodeMem ark_mem = (ARKodeMem) arkode_mem;
  N_VAbs(ycur, ark_mem->tempv1);
  N_VScale(ark_mem->reltol, ark_mem->tempv1, ark_mem->tempv1);
  N_VAddConst(ark_mem->tempv1, ark_mem->Sabstol, ark_mem->tempv1);
  if (ark_mem->atolmin0) {
    if (N_VMin(ark_mem->tempv1) <= ZERO) return(-1);
  }
  N_VInv(ark_mem->tempv1, weight);
  return(0);
}